

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

void * stb_sparse_ptr_matrix_get(stb_spmatrix *z,void *a,void *b,int create)

{
  stb__stb__spmatrix__hashpair *psVar1;
  undefined1 *puVar2;
  uint uVar3;
  void **ppvVar4;
  void *__s;
  int unaff_EBX;
  ulong uVar5;
  uint uVar6;
  int allow_old;
  undefined1 *in_R9;
  stb__ptrpair k;
  stb__ptrpair k_00;
  long lStackY_30;
  
  k.b = b;
  k.a = a;
  uVar3 = stb__stb__spmatrix_hash(k);
  if ((undefined1 *)b == &DAT_00000001 && (undefined1 *)a == &DAT_00000001) {
    if (z->has_empty != '\0') {
      lStackY_30 = 0x38;
LAB_0014f0a1:
      ppvVar4 = (void **)((long)&z->val_size + lStackY_30);
LAB_0014f120:
      __s = *ppvVar4;
      goto LAB_0014f128;
    }
  }
  else if ((undefined1 *)b == &DAT_00000002 && (undefined1 *)a == &DAT_00000002) {
    if (z->has_del != '\0') {
      lStackY_30 = 0x40;
      goto LAB_0014f0a1;
    }
  }
  else {
    uVar6 = z->mask & uVar3;
    psVar1 = z->table;
    uVar5 = (ulong)uVar6;
    in_R9 = (undefined1 *)psVar1[uVar5].k.a;
    if ((in_R9 != &DAT_00000001) || ((undefined1 *)psVar1[uVar5].k.b != &DAT_00000001)) {
      if ((in_R9 != (undefined1 *)a) || (psVar1[uVar5].k.b != b)) {
        __s = (void *)0x0;
        uVar5 = (ulong)uVar6;
        do {
          uVar5 = (ulong)((int)uVar5 + ((uVar3 >> 0x13) + (uVar3 >> 6) + uVar3 | 1) & z->mask);
          puVar2 = (undefined1 *)psVar1[uVar5].k.a;
          if ((puVar2 == &DAT_00000001) && ((undefined1 *)psVar1[uVar5].k.b == &DAT_00000001))
          goto LAB_0014f128;
        } while ((puVar2 != (undefined1 *)a) || (psVar1[uVar5].k.b != b));
      }
      ppvVar4 = &psVar1[uVar5].v;
      goto LAB_0014f120;
    }
  }
  __s = (void *)0x0;
LAB_0014f128:
  allow_old = (int)in_R9;
  if ((create != 0) && (__s == (void *)0x0)) {
    __s = stb_malloc_raw(z->arena,(long)z->val_size);
    if (__s == (void *)0x0) {
      __s = (void *)0x0;
    }
    else {
      memset(__s,0,(long)z->val_size);
      k_00.b = b;
      k_00.a = a;
      stb__stb__spmatrix_addset(z,k_00,__s,0,allow_old,unaff_EBX);
    }
  }
  return __s;
}

Assistant:

void *stb_sparse_ptr_matrix_get(stb_spmatrix *z, void *a, void *b, int create)
{
   stb__ptrpair t = { a,b };
   void *data = stb__spmatrix_get(z, t);
   if (!data && create) {
      data = stb_malloc_raw(z->arena, z->val_size);
      if (!data) return NULL;
      memset(data, 0, z->val_size);
      stb__spmatrix_add(z, t, data);
   }
   return data;
}